

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

PDFImageXObject * __thiscall TIFFImageHandler::WriteUntiledImageXObject(TIFFImageHandler *this)

{
  int iVar1;
  EStatusCode EVar2;
  ObjectIDType inImageObjectID;
  Trace *pTVar3;
  DictionaryContext *inImageContext;
  DictionaryContext *imageContext;
  ObjectIDType imageXObjectID;
  PDFStream *imageStream;
  PDFImageXObject *imageXObject;
  TIFFImageHandler *this_local;
  
  imageStream = (PDFStream *)0x0;
  imageXObjectID = 0;
  inImageObjectID = ObjectsContext::StartNewIndirectObject(this->mObjectsContext);
  if (inImageObjectID == 0) {
    pTVar3 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar3,
                      "TIFFImageHandler::WriteUntiledImageXObject, unexpected failure. unable to create image xobject"
                     );
  }
  else {
    inImageContext = ObjectsContext::StartDictionary(this->mObjectsContext);
    WriteCommonImageDictionaryProperties(this,inImageContext);
    DictionaryContext::WriteKey(inImageContext,&scWidth_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(inImageContext,(ulong)this->mT2p->tiff_width);
    DictionaryContext::WriteKey(inImageContext,&scHeight_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(inImageContext,(ulong)this->mT2p->tiff_length);
    WriteImageXObjectFilter(this,inImageContext,0);
    if ((this->mExtender == (IDocumentContextExtender *)0x0) ||
       (iVar1 = (*this->mExtender->_vptr_IDocumentContextExtender[7])
                          (this->mExtender,inImageObjectID,inImageContext,this->mObjectsContext,
                           this->mContainerDocumentContext), iVar1 == 0)) {
      imageXObjectID =
           (ObjectIDType)
           ObjectsContext::StartUnfilteredPDFStream(this->mObjectsContext,inImageContext);
      CalculateTiffSizeNoTiles(this);
      EVar2 = WriteImageData(this,(PDFStream *)imageXObjectID);
      if ((EVar2 == eSuccess) &&
         (EVar2 = ObjectsContext::EndPDFStream(this->mObjectsContext,(PDFStream *)imageXObjectID),
         EVar2 == eSuccess)) {
        imageStream = (PDFStream *)operator_new(0x20);
        PDFImageXObject::PDFImageXObject((PDFImageXObject *)imageStream,inImageObjectID);
        AddImagesProcsets(this,(PDFImageXObject *)imageStream);
      }
    }
    else {
      pTVar3 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar3,
                        "TIFFImageHandler::WriteTileImageXObject, unexpected failure. extender declared failure when writing image xobject."
                       );
    }
  }
  if (imageXObjectID != 0) {
    PDFStream::~PDFStream((PDFStream *)imageXObjectID);
    operator_delete((void *)imageXObjectID,0xf0);
  }
  return (PDFImageXObject *)imageStream;
}

Assistant:

PDFImageXObject* TIFFImageHandler::WriteUntiledImageXObject()
{
	PDFImageXObject* imageXObject = NULL;
	PDFStream* imageStream = NULL;

	do
	{
		ObjectIDType imageXObjectID = mObjectsContext->StartNewIndirectObject();
		if(imageXObjectID == 0)
		{
			TRACE_LOG("TIFFImageHandler::WriteUntiledImageXObject, unexpected failure. unable to create image xobject");
			break;
		}		
		DictionaryContext* imageContext = mObjectsContext->StartDictionary();
	
		WriteCommonImageDictionaryProperties(imageContext);

		// width
		imageContext->WriteKey(scWidth);
		imageContext->WriteIntegerValue(mT2p->tiff_width);

		// height
		imageContext->WriteKey(scHeight);
		imageContext->WriteIntegerValue(mT2p->tiff_length);

		// filter
		WriteImageXObjectFilter(imageContext,0);


		if(mExtender)
		{
			if(mExtender->OnTIFFImageXObjectWrite(imageXObjectID,imageContext,mObjectsContext,mContainerDocumentContext,this) != PDFHummus::eSuccess)
			{
				TRACE_LOG("TIFFImageHandler::WriteTileImageXObject, unexpected failure. extender declared failure when writing image xobject.");
				break;
			}
		}	

		imageStream = mObjectsContext->StartUnfilteredPDFStream(imageContext);

		CalculateTiffSizeNoTiles();

		if(WriteImageData(imageStream) != PDFHummus::eSuccess)
			break;

		if(mObjectsContext->EndPDFStream(imageStream) != PDFHummus::eSuccess)
			break;

		// Creating Image XObject procset value is dummy, because resources  on the 
		// container will be set externally.
		imageXObject = new PDFImageXObject(imageXObjectID);
		AddImagesProcsets(imageXObject);
	} while(false);


	delete imageStream;
	return imageXObject;
	
}